

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KnotAli.cc
# Opt level: O1

void updateVectors(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *seqs,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *seqs2,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *names,string *input_file,string *input_type)

{
  pointer pcVar1;
  pointer pbVar2;
  bool bVar3;
  size_type sVar4;
  uint uVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  long *plVar7;
  char cVar8;
  char cVar9;
  int iVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  istream *piVar12;
  size_type *psVar13;
  ulong uVar14;
  bool bVar15;
  size_type sVar16;
  ulong uVar17;
  _Alloc_hider _Var18;
  long lVar19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar20;
  string str;
  string temp;
  string type;
  string temp2;
  istringstream ss;
  ifstream in;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  uint local_444;
  ulong local_440;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_438;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_408;
  long *local_400;
  long local_3f8;
  long local_3f0 [2];
  long local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  value_type local_3b8 [3];
  ios_base local_340 [264];
  long local_238 [65];
  
  local_400 = local_3f0;
  pcVar1 = (input_type->_M_dataplus)._M_p;
  local_438 = seqs;
  local_430 = seqs2;
  local_408 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,pcVar1,pcVar1 + input_type->_M_string_length);
  plVar7 = local_400;
  if (local_3f8 != 0) {
    lVar19 = 0;
    do {
      iVar10 = toupper((int)*(char *)((long)plVar7 + lVar19));
      *(char *)((long)plVar7 + lVar19) = (char)iVar10;
      lVar19 = lVar19 + 1;
    } while (local_3f8 != lVar19);
  }
  iVar10 = std::__cxx11::string::compare((char *)&local_400);
  if (iVar10 == 0) {
    std::ifstream::ifstream(local_238,(input_file->_M_dataplus)._M_p,_S_in);
    local_3b8[0]._M_dataplus._M_p = (pointer)&local_3b8[0].field_2;
    local_3b8[0]._M_string_length = 0;
    local_3b8[0].field_2._M_local_buf[0] = '\0';
    local_444 = 0xffffffff;
    pvVar20 = local_438;
    do {
      local_440 = (ulong)(int)local_444;
      bVar15 = false;
      while( true ) {
        while( true ) {
          cVar8 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                  (char)(istream *)local_238);
          piVar12 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)local_238,(string *)local_3b8,cVar8);
          sVar4 = local_3b8[0]._M_string_length;
          _Var18._M_p = local_3b8[0]._M_dataplus._M_p;
          if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) != 0) {
            std::ifstream::close();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b8[0]._M_dataplus._M_p == &local_3b8[0].field_2) goto LAB_00118d19;
            lVar19 = CONCAT71(local_3b8[0].field_2._M_allocated_capacity._1_7_,
                              local_3b8[0].field_2._M_local_buf[0]);
            _Var18._M_p = local_3b8[0]._M_dataplus._M_p;
            goto LAB_00118d11;
          }
          if (*local_3b8[0]._M_dataplus._M_p != '>') break;
          std::__cxx11::string::substr((ulong)&local_468,(ulong)local_3b8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_408,&local_468);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p != &local_468.field_2) {
            operator_delete(local_468._M_dataplus._M_p,
                            CONCAT71(local_468.field_2._M_allocated_capacity._1_7_,
                                     local_468.field_2._M_local_buf[0]) + 1);
          }
          bVar15 = true;
        }
        if (bVar15) break;
        if (local_3b8[0]._M_string_length != 0) {
          sVar16 = 0;
          do {
            iVar10 = toupper((int)_Var18._M_p[sVar16]);
            _Var18._M_p[sVar16] = (char)iVar10;
            sVar16 = sVar16 + 1;
          } while (sVar4 != sVar16);
        }
        local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_468,local_3b8[0]._M_dataplus._M_p,
                   local_3b8[0]._M_dataplus._M_p + local_3b8[0]._M_string_length);
        if (-1 < (int)((int)local_468._M_string_length - 1U)) {
          uVar17 = (ulong)((int)local_468._M_string_length - 1U);
          do {
            if (local_468._M_dataplus._M_p[uVar17] == '-') {
              std::__cxx11::string::erase((ulong)&local_468,uVar17);
            }
            bVar3 = 0 < (long)uVar17;
            uVar17 = uVar17 - 1;
          } while (bVar3);
        }
        pvVar20 = local_430;
        uVar17 = local_440;
        std::operator+(&local_428,
                       (local_430->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + local_440,&local_468);
        std::__cxx11::string::_M_assign
                  ((string *)
                   ((pvVar20->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar17));
        pvVar20 = local_438;
        std::operator+(&local_3d8,
                       (local_438->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar17,local_3b8);
        std::__cxx11::string::_M_assign
                  ((string *)
                   ((pvVar20->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar17));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
          operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
        }
        pvVar20 = local_438;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._M_dataplus._M_p != &local_428.field_2) {
          operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_468._M_dataplus._M_p != &local_468.field_2) {
          operator_delete(local_468._M_dataplus._M_p,
                          CONCAT71(local_468.field_2._M_allocated_capacity._1_7_,
                                   local_468.field_2._M_local_buf[0]) + 1);
        }
      }
      if (local_3b8[0]._M_string_length != 0) {
        sVar16 = 0;
        do {
          iVar10 = toupper((int)_Var18._M_p[sVar16]);
          _Var18._M_p[sVar16] = (char)iVar10;
          sVar16 = sVar16 + 1;
        } while (sVar4 != sVar16);
      }
      local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_468,local_3b8[0]._M_dataplus._M_p,
                 local_3b8[0]._M_dataplus._M_p + local_3b8[0]._M_string_length);
      pvVar20 = local_438;
      uVar5 = local_444;
      if (-1 < (int)((int)local_468._M_string_length - 1U)) {
        uVar17 = (ulong)((int)local_468._M_string_length - 1U);
        do {
          if (local_468._M_dataplus._M_p[uVar17] == '-') {
            std::__cxx11::string::erase((ulong)&local_468,uVar17);
          }
          bVar15 = 0 < (long)uVar17;
          uVar17 = uVar17 - 1;
        } while (bVar15);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_430,&local_468);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar20,local_3b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p,
                        CONCAT71(local_468.field_2._M_allocated_capacity._1_7_,
                                 local_468.field_2._M_local_buf[0]) + 1);
      }
      local_444 = uVar5 + 1;
    } while( true );
  }
  iVar10 = std::__cxx11::string::compare((char *)&local_400);
  pvVar20 = local_438;
  if (iVar10 == 0) {
    std::ifstream::ifstream(local_238,(input_file->_M_dataplus)._M_p,_S_in);
    local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
    local_468._M_string_length = 0;
    local_468.field_2._M_local_buf[0] = '\0';
    cVar8 = std::ios::widen((char)local_238 + (char)*(undefined8 *)(local_238[0] + -0x18));
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_238,(string *)&local_468,cVar8);
    std::__cxx11::string::substr((ulong)local_3b8,(ulong)&local_468);
    iVar10 = std::__cxx11::string::compare((char *)local_3b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8[0]._M_dataplus._M_p != &local_3b8[0].field_2) {
      operator_delete(local_3b8[0]._M_dataplus._M_p,
                      CONCAT71(local_3b8[0].field_2._M_allocated_capacity._1_7_,
                               local_3b8[0].field_2._M_local_buf[0]) + 1);
    }
    if (iVar10 == 0) {
      cVar8 = std::ios::widen((char)(istream *)local_238 +
                              (char)*(undefined8 *)(local_238[0] + -0x18));
      piVar12 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)local_238,(string *)&local_468,cVar8);
      local_440 = CONCAT44(local_440._4_4_,(int)CONCAT71((int7)((ulong)piVar12 >> 8),1));
LAB_00118a2a:
      local_444 = 0;
LAB_00118a32:
      cVar8 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar12 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)local_238,(string *)&local_468,cVar8);
      if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) == 0) {
        if (*(pointer *)(local_408 + 8) == *(pointer *)local_408) goto code_r0x00118a79;
        goto LAB_00118a88;
      }
      std::ifstream::close();
      goto LAB_00118cfe;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Not a valid CLUSTAL file!",0x19);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  else {
    iVar10 = std::__cxx11::string::compare((char *)&local_400);
    if (iVar10 == 0) {
      std::ifstream::ifstream(local_238,(input_file->_M_dataplus)._M_p,_S_in);
      local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
      local_468._M_string_length = 0;
      local_468.field_2._M_local_buf[0] = '\0';
      cVar8 = std::ios::widen((char)local_238 + (char)*(undefined8 *)(local_238[0] + -0x18));
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_468,cVar8);
      cVar8 = std::ios::widen((char)(istream *)local_238 +
                              (char)*(undefined8 *)(local_238[0] + -0x18));
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_468,cVar8);
      while( true ) {
        std::__cxx11::string::substr((ulong)local_3b8,(ulong)&local_468);
        iVar10 = std::__cxx11::string::compare((char *)local_3b8);
        paVar11 = &local_3b8[0].field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8[0]._M_dataplus._M_p != paVar11) {
          operator_delete(local_3b8[0]._M_dataplus._M_p,
                          CONCAT71(local_3b8[0].field_2._M_allocated_capacity._1_7_,
                                   local_3b8[0].field_2._M_local_buf[0]) + 1);
          paVar11 = extraout_RAX;
        }
        cVar8 = (char)(istream *)local_238;
        if (iVar10 != 0) break;
        cVar8 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar8);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_238,(string *)&local_468,cVar8);
      }
      local_440 = CONCAT44(local_440._4_4_,(int)CONCAT71((int7)((ulong)paVar11 >> 8),1));
LAB_00118355:
      local_444 = 0;
      do {
        cVar9 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar8);
        piVar12 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)local_238,(string *)&local_468,cVar9);
        if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) != 0) {
LAB_00118cfe:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p != &local_468.field_2) {
            lVar19 = CONCAT71(local_468.field_2._M_allocated_capacity._1_7_,
                              local_468.field_2._M_local_buf[0]);
            _Var18._M_p = local_468._M_dataplus._M_p;
LAB_00118d11:
            operator_delete(_Var18._M_p,lVar19 + 1);
          }
LAB_00118d19:
          std::ifstream::~ifstream(local_238);
          pbVar2 = (pvVar20->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar19 = (long)(pvVar20->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
          if (lVar19 != 0) {
            lVar19 = lVar19 >> 5;
            psVar13 = &pbVar2->_M_string_length;
            lVar19 = lVar19 + (ulong)(lVar19 == 0);
            do {
              if (*psVar13 != (long)(int)pbVar2->_M_string_length) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "All sequences must be the same length in the alignment",0x36);
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                exit(0);
              }
              psVar13 = psVar13 + 4;
              lVar19 = lVar19 + -1;
            } while (lVar19 != 0);
          }
          if (local_400 != local_3f0) {
            operator_delete(local_400,local_3f0[0] + 1);
          }
          return;
        }
        std::__cxx11::string::substr((ulong)local_3b8,(ulong)&local_468);
        iVar10 = std::__cxx11::string::compare((char *)local_3b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8[0]._M_dataplus._M_p != &local_3b8[0].field_2) {
          operator_delete(local_3b8[0]._M_dataplus._M_p,
                          CONCAT71(local_3b8[0].field_2._M_allocated_capacity._1_7_,
                                   local_3b8[0].field_2._M_local_buf[0]) + 1);
        }
        if (iVar10 == 0) goto LAB_00118cfe;
        iVar10 = std::__cxx11::string::compare((char *)&local_468);
        if ((iVar10 == 0) || (*local_468._M_dataplus._M_p == ' ')) goto LAB_001185f2;
        if ((local_440 & 1) == 0) {
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)local_3b8,(string *)&local_468,_S_in);
          std::operator>>((istream *)local_3b8,(string *)&local_468);
          std::operator>>((istream *)local_3b8,(string *)&local_468);
          sVar4 = local_468._M_string_length;
          _Var18._M_p = local_468._M_dataplus._M_p;
          if (local_468._M_string_length != 0) {
            sVar16 = 0;
            do {
              iVar10 = toupper((int)_Var18._M_p[sVar16]);
              _Var18._M_p[sVar16] = (char)iVar10;
              sVar16 = sVar16 + 1;
            } while (sVar4 != sVar16);
          }
          pvVar20 = local_438;
          uVar17 = (ulong)local_444;
          std::operator+(&local_428,
                         (local_438->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar17,&local_468);
          std::__cxx11::string::operator=
                    ((string *)
                     ((pvVar20->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar17),(string *)&local_428);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_428._M_dataplus._M_p != &local_428.field_2) {
            operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
          }
          if (-1 < (int)((int)local_468._M_string_length - 1U)) {
            uVar14 = (ulong)((int)local_468._M_string_length - 1U);
            do {
              if (local_468._M_dataplus._M_p[uVar14] == '-') {
                std::__cxx11::string::erase((ulong)&local_468,uVar14);
              }
              bVar15 = 0 < (long)uVar14;
              uVar14 = uVar14 - 1;
            } while (bVar15);
          }
          pvVar6 = local_430;
          std::operator+(&local_428,
                         (local_430->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar17,&local_468);
          std::__cxx11::string::operator=
                    ((string *)
                     ((pvVar6->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar17),(string *)&local_428);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_428._M_dataplus._M_p != &local_428.field_2) {
            operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
          }
          local_444 = local_444 + 1;
        }
        else {
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)local_3b8,(string *)&local_468,_S_in);
          std::operator>>((istream *)local_3b8,(string *)&local_468);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_408,&local_468);
          std::operator>>((istream *)local_3b8,(string *)&local_468);
          sVar4 = local_468._M_string_length;
          _Var18._M_p = local_468._M_dataplus._M_p;
          if (local_468._M_string_length != 0) {
            sVar16 = 0;
            do {
              iVar10 = toupper((int)_Var18._M_p[sVar16]);
              _Var18._M_p[sVar16] = (char)iVar10;
              sVar16 = sVar16 + 1;
            } while (sVar4 != sVar16);
          }
          pvVar20 = local_438;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_438,&local_468);
          if (-1 < (int)((int)local_468._M_string_length - 1U)) {
            uVar17 = (ulong)((int)local_468._M_string_length - 1U);
            do {
              if (local_468._M_dataplus._M_p[uVar17] == '-') {
                std::__cxx11::string::erase((ulong)&local_468,uVar17);
              }
              bVar15 = 0 < (long)uVar17;
              uVar17 = uVar17 - 1;
            } while (bVar15);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_430,&local_468);
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
        std::ios_base::~ios_base(local_340);
      } while( true );
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Please give valid input type",0x1c);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  exit(1);
code_r0x00118a79:
  iVar10 = std::__cxx11::string::compare((char *)&local_468);
  if (iVar10 != 0) {
LAB_00118a88:
    iVar10 = std::__cxx11::string::compare((char *)&local_468);
    if ((iVar10 == 0) || (*local_468._M_dataplus._M_p == ' ')) goto LAB_00118ce4;
    if ((local_440 & 1) == 0) {
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_3b8,(string *)&local_468,_S_in);
      std::operator>>((istream *)local_3b8,(string *)&local_468);
      std::operator>>((istream *)local_3b8,(string *)&local_468);
      sVar4 = local_468._M_string_length;
      _Var18._M_p = local_468._M_dataplus._M_p;
      if (local_468._M_string_length != 0) {
        sVar16 = 0;
        do {
          iVar10 = toupper((int)_Var18._M_p[sVar16]);
          _Var18._M_p[sVar16] = (char)iVar10;
          sVar16 = sVar16 + 1;
        } while (sVar4 != sVar16);
      }
      pvVar20 = local_438;
      uVar17 = (ulong)local_444;
      std::operator+(&local_428,
                     (local_438->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar17,&local_468);
      local_3e0 = uVar17 * 0x20;
      std::__cxx11::string::operator=
                ((string *)
                 ((pvVar20->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + uVar17),(string *)&local_428);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
      }
      if (-1 < (int)((int)local_468._M_string_length - 1U)) {
        uVar17 = (ulong)((int)local_468._M_string_length - 1U);
        do {
          if (local_468._M_dataplus._M_p[uVar17] == '-') {
            std::__cxx11::string::erase((ulong)&local_468,uVar17);
          }
          bVar15 = 0 < (long)uVar17;
          uVar17 = uVar17 - 1;
        } while (bVar15);
      }
      lVar19 = local_3e0;
      pvVar6 = local_430;
      std::operator+(&local_428,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(((local_430->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     local_3e0),&local_468);
      std::__cxx11::string::operator=
                ((string *)
                 ((long)&(((pvVar6->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar19),
                 (string *)&local_428);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
      }
      local_444 = local_444 + 1;
      std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
      std::ios_base::~ios_base(local_340);
    }
    else {
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_3b8,(string *)&local_468,_S_in);
      std::operator>>((istream *)local_3b8,(string *)&local_468);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_408,&local_468);
      std::operator>>((istream *)local_3b8,(string *)&local_468);
      sVar4 = local_468._M_string_length;
      _Var18._M_p = local_468._M_dataplus._M_p;
      if (local_468._M_string_length != 0) {
        sVar16 = 0;
        do {
          iVar10 = toupper((int)_Var18._M_p[sVar16]);
          _Var18._M_p[sVar16] = (char)iVar10;
          sVar16 = sVar16 + 1;
        } while (sVar4 != sVar16);
      }
      pvVar20 = local_438;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_438,&local_468);
      if (-1 < (int)((int)local_468._M_string_length - 1U)) {
        uVar17 = (ulong)((int)local_468._M_string_length - 1U);
        do {
          if (local_468._M_dataplus._M_p[uVar17] == '-') {
            std::__cxx11::string::erase((ulong)&local_468,uVar17);
          }
          bVar15 = 0 < (long)uVar17;
          uVar17 = uVar17 - 1;
        } while (bVar15);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_430,&local_468);
      std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
      std::ios_base::~ios_base(local_340);
    }
  }
  goto LAB_00118a32;
LAB_00118ce4:
  local_440 = local_440 & 0xffffffff00000000;
  goto LAB_00118a2a;
LAB_001185f2:
  local_440 = local_440 & 0xffffffff00000000;
  goto LAB_00118355;
}

Assistant:

void updateVectors(std::vector<std::string> & seqs, std::vector<std::string> &seqs2, std::vector<std::string> & names, const std::string & input_file, const std::string& input_type){
    std::string type = input_type;
    std::transform(type.begin(), type.end(), type.begin(), ::toupper);
    // Get the arguments
    if(type == "FASTA"){

        std::ifstream in(input_file.c_str());
        std::string str;
        int i = -1;
        bool newSeq = false;
        while (std::getline(in, str)) {

            if(str[0] == '>'){
                newSeq = true;
                names.push_back(str.substr(1,str.length()));
                continue;
            } 
            
            if(newSeq == true) {
                std::transform(str.begin(), str.end(), str.begin(), ::toupper);

                std::string str2 = str;
                for(int j=str2.length()-1;j>=0;--j){
                    if(str2[j] == '-') str2.erase(j,1);
                }
                seqs2.push_back(str2);
                seqs.push_back(str);
                i++;
                newSeq = false;
            }
            else{
                std::transform(str.begin(), str.end(), str.begin(), ::toupper);
                std::string str2 = str;
                for(int j=str2.length()-1;j>=0;--j){
                    if(str2[j] == '-') str2.erase(j,1);
                }
                std::string temp = seqs2[i] + str2;
                seqs2[i] = temp;
                std::string temp2 = seqs[i] + str;
                seqs[i] = temp2;
            }
        }
        in.close();

    }else if(type == "CLUSTAL"){
        
        std::ifstream in(input_file.c_str());
        std::string str;
        int i = 0;

        bool first = true;
        std::getline(in, str);
        if(str.substr(0,7) != "CLUSTAL"){
            std::cout << "Not a valid CLUSTAL file!" << std::endl;
            exit (EXIT_FAILURE);
        }
        std::getline(in, str);
        while (std::getline(in, str)) {
            if(names.size() == 0 && str == "") continue;

            if(str == "" || str[0] == ' '){
                first = false;
                i = 0;
                continue;
            }

            if(first){
                std::istringstream ss(str);
                ss >> str;
                names.push_back(str);
                ss >> str;
                std::transform(str.begin(), str.end(), str.begin(), ::toupper);
                seqs.push_back(str);
                for(int j=str.length()-1;j>=0;--j){
                    if(str[j] == '-') str.erase(j,1);
                }
                seqs2.push_back(str);

            }
            else{
                std::istringstream ss(str);
                ss >> str;
                ss >> str;
                std::transform(str.begin(), str.end(), str.begin(), ::toupper);
                seqs[i] = seqs[i] + str;
                for(int j=str.length()-1;j>=0;--j){
                    if(str[j] == '-') str.erase(j,1);
                }
                seqs2[i] = seqs2[i] + str;
                ++i;
            }
        }
        in.close();
    }
    else if(type == "STOCKHOLM"){
        std::ifstream in(input_file.c_str());
        std::string str;
        int i = 0;
        bool first = true;
        std::getline(in,str);
        getline(in,str);
        while(str.substr(0,4) == "#=GF"){
            getline(in,str);
        }
        while(getline(in,str)){

            if(str.substr(0,4) == "#=GC") break;
            if(str == "" || str[0] == ' '){
                first = false;
                i = 0;
                continue;
            }

            if(first){
                std::istringstream ss(str);
                ss >> str;
                names.push_back(str);
                ss >> str;
                std::transform(str.begin(), str.end(), str.begin(), ::toupper);
                seqs.push_back(str);
                for(int j=str.length()-1;j>=0;--j){
                    if(str[j] == '-') str.erase(j,1);
                }
                seqs2.push_back(str);

            }
            else{
                std::istringstream ss(str);
                ss >> str;
                ss >> str;
                std::transform(str.begin(), str.end(), str.begin(), ::toupper);
                seqs[i] = seqs[i] + str;
                for(int j=str.length()-1;j>=0;--j){
                    if(str[j] == '-') str.erase(j,1);
                }
                seqs2[i] = seqs2[i] + str;
                ++i;
            }
        }

    }
    else{
        std::cout << "Please give valid input type" << std::endl;
        exit (EXIT_FAILURE);
    }
    int length = seqs[0].length();
    for(int i=0;i<seqs.size();++i){
        if (seqs[i].length() != length){
            std::cout << "All sequences must be the same length in the alignment" << std::endl;
            exit(0);
        }
    }
}